

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_model-base-ekf-flex-estimator-imu.cpp
# Opt level: O2

int test(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ostream *poVar5;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar6;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar7;
  Matrix<double,__1,_1,_0,__1,_1> *src;
  Scalar *pSVar8;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  Matrix *pMVar9;
  uint time;
  char *pcVar10;
  double dVar11;
  Scalar SVar12;
  timespec tVar13;
  timespec tVar14;
  double local_1c70;
  Vector errorsum;
  Vector computeTime;
  double unitCov;
  Vector flexibility;
  Vector error;
  Vector xdifference;
  Vector u0;
  timespec time2;
  timespec time1;
  Vector3 v2;
  Vector3 v1;
  Scalar local_1b50;
  Scalar local_1b48;
  Scalar local_1b40;
  Scalar local_1b38;
  Scalar local_1b30;
  Scalar local_1b28;
  Scalar local_1b20;
  Scalar local_1b18;
  Scalar local_1b10;
  Scalar local_1b08;
  IndexedMatrixArray y;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1af8 [80];
  Matrix Cov;
  IndexedMatrixArray u;
  undefined4 uStack_1a8c;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1a88 [80];
  timespec time3;
  IndexedMatrixArray x_output;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1a20 [80];
  IndexedMatrixArray xRef;
  undefined4 uStack_19cc;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_19c8 [80];
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *local_1978 [7];
  Scalar local_1940;
  Scalar local_1938;
  Scalar local_1930;
  Scalar local_1928;
  Scalar local_1920;
  Scalar local_1918;
  Scalar local_1910;
  Scalar local_1908;
  Scalar local_1900;
  Scalar local_18f8;
  Scalar local_18f0;
  Scalar local_18e8;
  Scalar local_18e0;
  IndexedMatrixArray computationTime_output;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_18d0 [80];
  IndexedMatrixArray u_output;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1878 [80];
  IndexedMatrixArray y_output;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1820 [80];
  IndexedMatrixArray deltax_output;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_17c8 [80];
  ModelBaseEKFFlexEstimatorIMU est;
  Matrix<double,_3,_1,_0,_3,_1> local_c0;
  Matrix<double,_3,_1,_0,_3,_1> local_a8 [5];
  
  poVar5 = std::operator<<((ostream *)&std::cout,"Starting");
  std::endl<char,std::char_traits<char>>(poVar5);
  Cov.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  Cov.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  Cov.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&Cov.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,6,6);
  unitCov = 0.01;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&est,&Cov,&unitCov);
  _y = 0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&est,
                      (Scalar *)&y);
  _u = 0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,(Scalar *)&u);
  _xRef = 0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,(Scalar *)&xRef);
  _x_output = 0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,(Scalar *)&x_output);
  _y_output = 0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,(Scalar *)&y_output);
  _u_output = 0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,(Scalar *)&u_output);
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&unitCov);
  _deltax_output = 0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,(Scalar *)&deltax_output);
  _computationTime_output = 0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,(Scalar *)&computationTime_output);
  error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,(Scalar *)&error);
  local_1978[0] = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)0x0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,(Scalar *)local_1978);
  v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,(Scalar *)&v1);
  v2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,(Scalar *)&v2);
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&unitCov);
  u0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0
  ;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,(Scalar *)&u0);
  flexibility.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,(Scalar *)&flexibility);
  xdifference.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,(Scalar *)&xdifference);
  time1.tv_sec = 0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,(Scalar *)&time1);
  time2.tv_sec = 0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,(Scalar *)&time2);
  time3.tv_sec = 0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,(Scalar *)&time3);
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&unitCov);
  computeTime.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,(Scalar *)&computeTime);
  errorsum.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,(Scalar *)&errorsum);
  local_1b08 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_1b08);
  local_1b10 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_1b10);
  local_1b18 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_1b18);
  local_1b20 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_1b20);
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&unitCov);
  local_1b28 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_1b28);
  local_1b30 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_1b30);
  local_1b38 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_1b38);
  local_1b40 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_1b40);
  local_1b48 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_1b48);
  local_1b50 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_1b50);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar6,&unitCov);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&est);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((ConstantReturnType *)&est,0x2a,1)
  ;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&u0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&est);
  _y = 0x3f8bc92c2e5c33dd;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&est,&u0,(Scalar *)&y);
  _u = 0x3f592a737110e454;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&est,(Scalar *)&u
                     );
  _xRef = 0x3fe9d8c2a454de7f;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,(Scalar *)&xRef);
  _x_output = 0xbec61cdfd02dd708;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,(Scalar *)&x_output);
  _y_output = 0xbe477685a6784496;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,(Scalar *)&y_output);
  _u_output = 0x3e6eb23223de8052;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,(Scalar *)&u_output);
  _deltax_output = 0x4005b525460aa64c;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,(Scalar *)&deltax_output);
  _computationTime_output = 0x3fd3a92a30553261;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,(Scalar *)&computationTime_output);
  error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x4064315810624dd3;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,(Scalar *)&error);
  local_1978[0] = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)0x40481141205bc01a;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,(Scalar *)local_1978);
  v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       46.9498;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,(Scalar *)&v1);
  v2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       1.76068;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,(Scalar *)&v2);
  flexibility.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0xbfb619eebe8f1c68;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,(Scalar *)&flexibility);
  xdifference.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0xbfe3092ee84ad795;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,(Scalar *)&xdifference);
  time1.tv_sec = -0x405b67ae6502b918;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,(Scalar *)&time1);
  time2.tv_sec = 0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,(Scalar *)&time2);
  time3.tv_sec = 0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,(Scalar *)&time3);
  computeTime.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,(Scalar *)&computeTime);
  errorsum.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,(Scalar *)&errorsum);
  local_1b08 = 0.0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_1b08);
  local_1b10 = 0.0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_1b10);
  local_1b18 = 0.0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_1b18);
  local_1b20 = 0.0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_1b20);
  local_1b28 = 0.0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_1b28);
  local_1b30 = 0.0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_1b30);
  local_1b38 = 0.0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_1b38);
  local_1b40 = 0.0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_1b40);
  local_1b48 = -0.098;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_1b48);
  local_1b50 = -6.23712e-11;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_1b50);
  local_18e0 = 1.1174;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_18e0);
  local_18e8 = 1.58984e-22;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_18e8);
  local_18f0 = -5.43636e-21;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_18f0);
  local_18f8 = 3.9598e-22;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_18f8);
  local_1900 = -2.99589e-06;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_1900);
  local_1908 = -1.24742e-08;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_1908);
  local_1910 = -4.7647e-18;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_1910);
  local_1918 = 3.17968e-20;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_1918);
  local_1920 = -1.08727e-18;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_1920);
  local_1928 = 7.91959e-20;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_1928);
  local_1930 = -0.000299589;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_1930);
  local_1938 = -1.24742e-06;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_1938);
  local_1940 = -4.7647e-16;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar7,&local_1940);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&est);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
  ModelBaseEKFFlexEstimatorIMU(&est,0.005);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setSamplingPeriod(0.005);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setInput((Matrix *)&est);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setMeasurementInput
            ((Matrix *)&est);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setRobotMass(56.867992);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setOnes
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&v1);
  _u = 1000;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&y,(int *)&u,(StorageBaseType *)&v1);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (&v1,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                  *)&y);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (&local_c0,&v1);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setOnes
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&v2);
  _u = 1000;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&y,(int *)&u,(StorageBaseType *)&v2);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (&v2,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                  *)&y);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (local_a8,&v2);
  _xRef = 40000;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&u,(int *)&xRef,(StorageBaseType *)&x_output);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&y,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&u);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKfe((Matrix *)&est);
  _xRef = 600;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&u,(int *)&xRef,(StorageBaseType *)&x_output);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&y,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&u);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKte((Matrix *)&est);
  _xRef = 600;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&u,(int *)&xRef,(StorageBaseType *)&x_output);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&y,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&u);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKfv((Matrix *)&est);
  _xRef = CONCAT44(uStack_19cc,0x3c);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&u,(int *)&xRef,(StorageBaseType *)&x_output);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&y,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&u);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKtv((Matrix *)&est);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&y);
  poVar5 = std::operator<<((ostream *)&std::cout,"Loading measurements file");
  std::endl<char,std::char_traits<char>>(poVar5);
  stateObservation::IndexedMatrixArray::getFromFile((char *)&y,0x110073,1);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&u);
  poVar5 = std::operator<<((ostream *)&std::cout,"Loading input file");
  std::endl<char,std::char_traits<char>>(poVar5);
  stateObservation::IndexedMatrixArray::getFromFile((char *)&u,0x11009d,1);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&xRef);
  poVar5 = std::operator<<((ostream *)&std::cout,"Loading reference state file");
  std::endl<char,std::char_traits<char>>(poVar5);
  stateObservation::IndexedMatrixArray::getFromFile((char *)&xRef,0x1100cb,0x12);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&x_output);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&y_output);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&u_output);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&deltax_output);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
  setMeasurementNoiseCovariance((Matrix *)&est);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setContactsNumber
            ((uint)&est);
  flexibility.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  flexibility.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&flexibility.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,0x12);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&xdifference,
             (DenseStorage<double,__1,__1,_1,_0> *)&flexibility);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&computationTime_output);
  computeTime.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  computeTime.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&computeTime.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,1);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((ConstantReturnType *)&error,0x12)
  ;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&errorsum,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&error);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setContactModel((uint)&est)
  ;
  poVar5 = std::operator<<((ostream *)&std::cout,"Beginning reconstruction ");
  std::endl<char,std::char_traits<char>>(poVar5);
  local_1c70 = 0.0;
  time = 2;
  while( true ) {
    if (time == 0x578) break;
    local_1978[0] =
         (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
         stateObservation::IndexedMatrixArray::operator[](&y,time);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&error,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)local_1978
              );
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setMeasurement
              ((Matrix *)&est);
    free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    local_1978[0] =
         (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
         stateObservation::IndexedMatrixArray::operator[](&u,time);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&error,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)local_1978
              );
    stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setMeasurementInput
              ((Matrix *)&est);
    free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    clock_gettime(2,(timespec *)&time1);
    clock_gettime(2,(timespec *)&time2);
    src = (Matrix<double,__1,_1,_0,__1,_1> *)
          stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
          getFlexibilityVector();
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&flexibility,src);
    clock_gettime(2,(timespec *)&time3);
    tVar13 = diff(&time2,&time3);
    tVar14 = diff(&time1,&time2);
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&computeTime,0
                       );
    *pSVar8 = (double)tVar13.tv_nsec - (double)tVar14.tv_nsec;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<int>
              ((Type *)local_1978,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&flexibility
               ,0x12);
    other = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
            stateObservation::IndexedMatrixArray::operator[](&xRef,time);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)&error,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)local_1978,
               other);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
              (&xdifference,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)&error);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&error,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xdifference,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&xdifference);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&errorsum,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&error);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&error,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&flexibility);
    stateObservation::IndexedMatrixArray::setValue(&x_output,(Matrix *)&error,time);
    free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    pMVar9 = stateObservation::IndexedMatrixArray::operator[](&y,time);
    stateObservation::IndexedMatrixArray::setValue(&y_output,pMVar9,time);
    pMVar9 = stateObservation::IndexedMatrixArray::operator[](&u,time);
    stateObservation::IndexedMatrixArray::setValue(&u_output,pMVar9,time);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&error,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&xdifference);
    stateObservation::IndexedMatrixArray::setValue(&deltax_output,(Matrix *)&error,time);
    free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    pSVar8 = (Scalar *)
             stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
             getComputeFlexibilityTime();
    SVar12 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&computeTime,0
                       );
    *pSVar8 = SVar12;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&error,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&computeTime);
    stateObservation::IndexedMatrixArray::setValue(&computationTime_output,(Matrix *)&error,time);
    free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&computeTime,0
                       );
    local_1c70 = local_1c70 + *pSVar8;
    time = time + 1;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Completed ");
  std::endl<char,std::char_traits<char>>(poVar5);
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&computeTime,0);
  *pSVar8 = local_1c70 / 1398.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&error,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&computeTime);
  stateObservation::IndexedMatrixArray::setValue(&computationTime_output,(Matrix *)&error,0x578);
  free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  stateObservation::IndexedMatrixArray::writeInFile((char *)&computationTime_output);
  stateObservation::IndexedMatrixArray::writeInFile((char *)&x_output);
  stateObservation::IndexedMatrixArray::writeInFile((char *)&y_output);
  stateObservation::IndexedMatrixArray::writeInFile((char *)&u_output);
  local_1978[0]._0_4_ = 0x576;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator/
            ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&error,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&errorsum,(uint *)local_1978
            );
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            (&errorsum,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&error);
  local_1978[0] =
       (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)CONCAT44(local_1978[0]._4_4_,6)
  ;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&error,(int *)local_1978);
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&errorsum,0);
  dVar11 = *pSVar8;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&errorsum,1);
  dVar1 = *pSVar8;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&errorsum,2);
  dVar11 = (dVar11 + dVar1 + *pSVar8) / 1398.0;
  if (dVar11 < 0.0) {
    SVar12 = sqrt(dVar11);
  }
  else {
    SVar12 = SQRT(dVar11);
  }
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&error,0);
  *pSVar8 = SVar12;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&errorsum,6);
  dVar11 = *pSVar8;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&errorsum,7);
  dVar1 = *pSVar8;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&errorsum,8);
  dVar11 = (dVar11 + dVar1 + *pSVar8) / 1398.0;
  if (dVar11 < 0.0) {
    SVar12 = sqrt(dVar11);
  }
  else {
    SVar12 = SQRT(dVar11);
  }
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&error,1);
  *pSVar8 = SVar12;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&errorsum,0xc);
  dVar11 = *pSVar8;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&errorsum,0xd);
  dVar1 = *pSVar8;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&errorsum,0xe);
  dVar11 = (dVar11 + dVar1 + *pSVar8) / 1398.0;
  if (dVar11 < 0.0) {
    SVar12 = sqrt(dVar11);
  }
  else {
    SVar12 = SQRT(dVar11);
  }
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&error,2);
  *pSVar8 = SVar12;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&errorsum,3);
  dVar11 = *pSVar8;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&errorsum,4);
  dVar1 = *pSVar8;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&errorsum,5);
  dVar11 = (dVar11 + dVar1 + *pSVar8) / 1398.0;
  if (dVar11 < 0.0) {
    SVar12 = sqrt(dVar11);
  }
  else {
    SVar12 = SQRT(dVar11);
  }
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&error,3);
  *pSVar8 = SVar12;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&errorsum,9);
  dVar11 = *pSVar8;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&errorsum,10);
  dVar1 = *pSVar8;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&errorsum,0xb);
  dVar11 = (dVar11 + dVar1 + *pSVar8) / 1398.0;
  if (dVar11 < 0.0) {
    SVar12 = sqrt(dVar11);
  }
  else {
    SVar12 = SQRT(dVar11);
  }
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&error,4);
  *pSVar8 = SVar12;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&errorsum,0xf);
  dVar11 = *pSVar8;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&errorsum,0x10);
  dVar1 = *pSVar8;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&errorsum,0x11);
  dVar11 = (dVar11 + dVar1 + *pSVar8) / 1398.0;
  if (dVar11 < 0.0) {
    SVar12 = sqrt(dVar11);
  }
  else {
    SVar12 = SQRT(dVar11);
  }
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&error,5);
  *pSVar8 = SVar12;
  std::operator<<((ostream *)&std::cout,"Mean computation time ");
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&computeTime,0);
  poVar5 = std::ostream::_M_insert<double>(*pSVar8);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"Mean error ");
  local_1978[0] = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&error;
  poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     *)local_1978);
  std::endl<char,std::char_traits<char>>(poVar5);
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&error,0);
  dVar11 = *pSVar8;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&error,1);
  dVar1 = *pSVar8;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&error,2);
  dVar2 = *pSVar8;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&error,3);
  dVar3 = *pSVar8;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&error,4);
  dVar4 = *pSVar8;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&error,5);
  dVar11 = dVar3 * 10.0 + dVar2 * 10.0 + dVar11 * 40000.0 + dVar1 * 600.0 + dVar4 + *pSVar8;
  std::operator<<((ostream *)&std::cout,"Synthetic error ");
  poVar5 = std::ostream::_M_insert<double>(dVar11);
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar10 = "Succeed !!";
  if (0.2 < dVar11) {
    pcVar10 = "Failed : error is too big !!";
  }
  poVar5 = std::operator<<((ostream *)&std::cout,pcVar10);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"The end");
  std::endl<char,std::char_traits<char>>(poVar5);
  free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(errorsum.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(computeTime.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_18d0);
  free(xdifference.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(flexibility.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_17c8);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_1878);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_1820);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_1a20);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_19c8);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_1a88);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_1af8);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
  ~ModelBaseEKFFlexEstimatorIMU(&est);
  free(u0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(Cov.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return 1;
}

Assistant:

int test()
{
    std::cout << "Starting" << std::endl;

  /// sampling period
    const double dt=5e-3;

  /// Measurement noise covariance
    Matrix Cov;
    Cov.resize(6,6);
    double unitCov = 1e-2;
    Cov <<  unitCov,0,0,0,0,0,
            0,unitCov,0,0,0,0,
            0,0,unitCov,0,0,0,
            0,0,0,unitCov,0,0,
            0,0,0,0,unitCov,0,
            0,0,0,0,0,unitCov;

  /// Initializations
    // Dimensions
    const unsigned kinit=0;
    const unsigned kmax=1400;
    const unsigned measurementSize=6;
    const unsigned inputSize=54;
    const unsigned stateSize=18;
    unsigned contactNbr = 2;
    // State initialization => not used here because it is set in model-base-ekf-flex-estimator-imu

     // Input initialization
    Vector u0=Vector::Zero(inputSize-6*contactNbr,1);
    u0 <<  0.0135673,
             0.001536,
             0.80771,
             -2.63605e-06,
             -1.09258e-08,
             5.71759e-08,
             2.71345,
             0.3072,
             161.542,
             48.1348,
             46.9498,
             1.76068,
             -0.0863332,
             -0.594871,
             -0.0402246,
             0,
             0,
             0,
             0,
             0,
             0,
             0,
             0,
             0,
             0,
             0,
             0,
             -0.098,
             -6.23712e-11,
             1.1174,
             1.58984e-22,
             -5.43636e-21,
             3.9598e-22,
             -2.99589e-06,
             -1.24742e-08,
             -4.7647e-18,
             3.17968e-20,
             -1.08727e-18,
             7.91959e-20,
             -0.000299589,
             -1.24742e-06,
             -4.7647e-16;

    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU est;
    est.setSamplingPeriod(dt);
    est.setInput(u0);
    est.setMeasurementInput(u0);

    est.setRobotMass(56.8679920);
    stateObservation::Vector3 v1; v1.setOnes();
    v1=1000*v1;
    est.setTorquesLimit(v1);
    stateObservation::Vector3 v2; v2.setOnes();
    v2=1000*v2;
    est.setForcesLimit(v2);
    est.setKfe(40000*Matrix3::Identity());
    est.setKte(600*Matrix3::Identity());
    est.setKfv(600*Matrix3::Identity());
    est.setKtv(60*Matrix3::Identity());

   /// Definitions of input vectors
     // Measurement
    IndexedMatrixArray y;
    std::cout << "Loading measurements file" << std::endl;
    y.getFromFile("source_measurement.dat",1,measurementSize);
     // Input
    IndexedMatrixArray u;
     std::cout << "Loading input file" << std::endl;
    u.getFromFile("source_input.dat",1,inputSize);
      //state
    IndexedMatrixArray xRef;
      std::cout << "Loading reference state file" << std::endl;
    xRef.getFromFile("source_state.dat",stateSize,1);

   /// Definition of ouptut vectors
     // State: what we want
    IndexedMatrixArray x_output;
     // Measurement
    IndexedMatrixArray y_output;
     // Input
    IndexedMatrixArray u_output;

    IndexedMatrixArray deltax_output;


    est.setMeasurementNoiseCovariance(Cov);

    est.setContactsNumber(contactNbr);


    Vector flexibility;
    flexibility.resize(18);
    Vector xdifference(flexibility);

    timespec time1, time2, time3;
    IndexedMatrixArray computationTime_output;
    double computationTime_moy=0;
    Vector computeTime;
    computeTime.resize(1);

    Vector errorsum=Vector::Zero(18);

    est.setContactModel(stateObservation::flexibilityEstimation::
                ModelBaseEKFFlexEstimatorIMU::contactModel::elasticContact);

    std::cout << "Beginning reconstruction "<<std::endl;
    for (unsigned k=kinit+2;k<kmax;++k)
    {
        est.setMeasurement(y[k].transpose());
        est.setMeasurementInput(u[k].transpose());

        clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time1);
        clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time2);

        flexibility = est.getFlexibilityVector();

        clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time3);
        computeTime[0]=(double)diff(time2,time3).tv_nsec-(double)diff(time1,time2).tv_nsec;

        xdifference =flexibility.head(18)-xRef[k];

        errorsum += xdifference.cwiseProduct(xdifference);

        x_output.setValue(flexibility,k);
        y_output.setValue(y[k],k);
        u_output.setValue(u[k],k);
        deltax_output.setValue(xdifference,k);

        computeTime[0]=est.getComputeFlexibilityTime();
        computationTime_output.setValue(computeTime,k);
        computationTime_moy+=computeTime[0];
    }

    std::cout << "Completed "<<std::endl;

    computeTime[0]=computationTime_moy/(kmax-kinit-2);
    computationTime_output.setValue(computeTime,kmax);
    computationTime_output.writeInFile("computationTime.dat");

    x_output.writeInFile("state.dat");
    y_output.writeInFile("measurement.dat");
    u_output.writeInFile("input.dat");

    errorsum = errorsum/(kmax-kinit-2);

    Vector error(6);

    error(0)= sqrt((errorsum(kine::pos) + errorsum(kine::pos+1) + errorsum(kine::pos+2))/(kmax-kinit-2));
    error(1) = sqrt((errorsum(kine::linVel) + errorsum(kine::linVel+1) + errorsum(kine::linVel+2))/(kmax-kinit-2));
    error(2) = sqrt((errorsum(kine::linAcc) + errorsum(kine::linAcc+1) + errorsum(kine::linAcc+2))/(kmax-kinit-2));
    error(3) = sqrt((errorsum(kine::ori) + errorsum(kine::ori+1) + errorsum(kine::ori+2))/(kmax-kinit-2));
    error(4) = sqrt((errorsum(kine::angVel) + errorsum(kine::angVel+1) + errorsum(kine::angVel+2))/(kmax-kinit-2));
    error(5) = sqrt((errorsum(kine::angAcc) + errorsum(kine::angAcc+1) + errorsum(kine::angAcc+2))/(kmax-kinit-2));

    std::cout << "Mean computation time " << computeTime[0] <<std::endl;

    std::cout << "Mean error " << error.transpose() <<std::endl;

    double syntherror = 40000*error(0)+600*error(1)+10*error(2)+10*error(3)+error(4)+error(5);

    std::cout << "Synthetic error " << syntherror <<std::endl;

    if (syntherror>0.2)
    {
      std::cout << "Failed : error is too big !!"<< std::endl <<"The end" << std::endl;
      return 1;
    }
#ifdef NDEBUG
    if (computeTime[0]>2e5)
     {
      std::cout << "Failed : Computation time is too long !!"<< std::endl <<"The end" << std::endl;
      return 2;
    }
#endif


    std::cout << "Succeed !!"<< std::endl <<"The end" << std::endl;
    return 1;





}